

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

Vec_Str_t * Vec_StrAlloc(int nCap)

{
  Vec_Str_t *pVVar1;
  char *local_20;
  Vec_Str_t *p;
  int nCap_local;
  
  pVVar1 = (Vec_Str_t *)malloc(0x10);
  p._4_4_ = nCap;
  if ((0 < nCap) && (nCap < 0x10)) {
    p._4_4_ = 0x10;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = p._4_4_;
  if (pVVar1->nCap == 0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = (char *)malloc((long)pVVar1->nCap);
  }
  pVVar1->pArray = local_20;
  return pVVar1;
}

Assistant:

static inline Vec_Str_t * Vec_StrAlloc( int nCap )
{
    Vec_Str_t * p;
    p = ABC_ALLOC( Vec_Str_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( char, p->nCap ) : NULL;
    return p;
}